

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_do(connectdata *conn,_Bool *done)

{
  anon_union_208_8_f709340f_for_proto *pp;
  SessionHandle *pSVar1;
  bool bVar2;
  CURLcode CVar3;
  SSHPROTO *pSVar4;
  char *pcVar5;
  char *pcVar6;
  undefined1 connected;
  char *fmt;
  pop3_conn *pop3c;
  _Bool _Var7;
  
  *done = false;
  Curl_reset_reqproto(conn);
  pSVar1 = conn->data;
  pSVar4 = (pSVar1->state).proto.ssh;
  if (pSVar4 == (SSHPROTO *)0x0) {
    pSVar4 = (SSHPROTO *)(*Curl_ccalloc)(0x28,1);
    (pSVar1->state).proto.ssh = pSVar4;
    if (pSVar4 == (SSHPROTO *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
      bVar2 = false;
      goto LAB_00133aa5;
    }
  }
  pSVar4->path = (char *)&(pSVar1->req).bytecount;
  pSVar4[1].path = conn->user;
  pSVar4[2].path = conn->passwd;
  CVar3 = CURLE_OK;
  bVar2 = true;
LAB_00133aa5:
  if (bVar2) {
    CVar3 = Curl_urldecode(conn->data,(conn->data->state).path,0,&(conn->proto).ftpc.entrypath,
                           (size_t *)0x0,true);
    if (CVar3 == CURLE_OK) {
      pcVar6 = (conn->data->set).str[4];
      CVar3 = CURLE_OK;
      if (pcVar6 != (char *)0x0) {
        CVar3 = Curl_urldecode(conn->data,pcVar6,0,&(conn->proto).pop3c.custom,(size_t *)0x0,true);
      }
      if (CVar3 == CURLE_OK) {
        pSVar1 = conn->data;
        (pSVar1->req).size = -1;
        Curl_pgrsSetUploadCounter(pSVar1,0);
        Curl_pgrsSetDownloadCounter(pSVar1,0);
        Curl_pgrsSetUploadSize(pSVar1,0);
        Curl_pgrsSetDownloadSize(pSVar1,0);
        pSVar1 = conn->data;
        if ((pSVar1->set).opt_no_body == true) {
          ((pSVar1->state).proto.ftp)->transfer = FTPTRANSFER_INFO;
        }
        *done = false;
        pcVar6 = (conn->proto).ftpc.entrypath;
        if (*pcVar6 == '\0') {
          pcVar5 = "LIST";
        }
        else {
          _Var7 = (pSVar1->set).ftp_list_only;
          pcVar5 = "RETR";
          if (_Var7 != false) {
            pcVar5 = "LIST";
          }
          if (_Var7 == true) {
            ((pSVar1->state).proto.ftp)->transfer = FTPTRANSFER_INFO;
            pcVar5 = "LIST";
          }
        }
        pp = &conn->proto;
        fmt = (conn->proto).pop3c.custom;
        if (*pcVar6 == '\0') {
          if ((fmt == (char *)0x0) || (*fmt == '\0')) {
            fmt = pcVar5;
          }
          CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,fmt);
        }
        else {
          if ((fmt == (char *)0x0) || (pcVar6 = fmt, *fmt == '\0')) {
            pcVar6 = pcVar5;
          }
          fmt = "%s %s";
          CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"%s %s",pcVar6);
        }
        connected = SUB81(fmt,0);
        if (CVar3 == CURLE_OK) {
          (conn->proto).ftpc.count2 = 0x10;
          if ((conn->data->state).used_interface == Curl_if_multi) {
            CVar3 = Curl_pp_multi_statemach(&(pp->ftpc).pp);
            _Var7 = (conn->proto).ftpc.count2 == 0;
          }
          else {
            _Var7 = true;
            do {
              connected = SUB81(fmt,0);
              if ((conn->proto).ftpc.count2 == 0) {
                CVar3 = CURLE_OK;
                break;
              }
              CVar3 = Curl_pp_easy_statemach(&(pp->ftpc).pp);
              connected = SUB81(fmt,0);
            } while (CVar3 == CURLE_OK);
          }
          *done = _Var7;
        }
        if ((CVar3 == CURLE_OK) && (CVar3 = CURLE_OK, *done == true)) {
          pop3_dophase_done(conn,(_Bool)connected);
        }
      }
    }
  }
  return CVar3;
}

Assistant:

static CURLcode pop3_do(struct connectdata *conn, bool *done)
{
  CURLcode retcode = CURLE_OK;

  *done = FALSE; /* default to false */

  /*
    Since connections can be re-used between SessionHandles, this might be a
    connection already existing but on a fresh SessionHandle struct so we must
    make sure we have a good 'struct POP3' to play with. For new connections,
    the struct POP3 is allocated and setup in the pop3_connect() function.
  */
  Curl_reset_reqproto(conn);
  retcode = pop3_init(conn);
  if(retcode)
    return retcode;

  /* Parse the URL path */
  retcode = pop3_parse_url_path(conn);
  if(retcode)
    return retcode;

  /* Parse the custom request */
  retcode = pop3_parse_custom_request(conn);
  if(retcode)
    return retcode;

  retcode = pop3_regular_transfer(conn, done);

  return retcode;
}